

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffdkey(fitsfile *fptr,char *keyname,int *status)

{
  int iVar1;
  size_t sVar2;
  int *in_RDX;
  undefined8 in_RSI;
  bool bVar3;
  char nextcomm [73];
  char message [81];
  char value [71];
  char comm [73];
  char valstring [71];
  int len;
  int keypos;
  char in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe39;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  fitsfile *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffee9;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int local_28;
  int local_4;
  
  if (*in_RDX < 1) {
    iVar1 = ffgkey(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (iVar1 < 1) {
      ffdrec(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
      if (*in_RDX < 1) {
        ffpmrk();
        ffc2s(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
              (int *)CONCAT71(in_stack_fffffffffffffe39,in_stack_fffffffffffffe38));
        if (*in_RDX == 0xcc) {
          ffcmrk();
          *in_RDX = 0;
        }
        else {
          sVar2 = strlen(&stack0xfffffffffffffee8);
          local_28 = (int)sVar2;
          while( true ) {
            bVar3 = false;
            if (local_28 != 0) {
              bVar3 = (&stack0xfffffffffffffee8)[local_28 + -1] == '&';
            }
            if (!bVar3) break;
            ffgcnt((fitsfile *)CONCAT71(in_stack_fffffffffffffee9,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
            if ((in_stack_fffffffffffffee8 == '\0') &&
               (sVar2 = strlen(&stack0xfffffffffffffe38), sVar2 == 0)) {
              local_28 = 0;
            }
            else {
              ffdrec(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
              sVar2 = strlen(&stack0xfffffffffffffee8);
              local_28 = (int)sVar2;
            }
          }
        }
        local_4 = *in_RDX;
      }
      else {
        local_4 = *in_RDX;
      }
    }
    else {
      snprintf(&stack0xfffffffffffffe88,0x51,"Could not find the %s keyword to delete (ffdkey)",
               in_RSI);
      ffpmsg((char *)0x202bee);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, comm, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                keyname);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, value, nextcomm, status);
        if (*value || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}